

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general.c
# Opt level: O2

axbStatus_t axbOpBackendRegister(axbHandle_s *handle,axbOpBackend_s *ops)

{
  axbOpBackend_s **__ptr;
  size_t i;
  axbOpBackend_s **ppaVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar3 = handle->opBackends_size;
  if (sVar3 == handle->opBackends_capacity) {
    __ptr = handle->opBackends;
    handle->opBackends_capacity = sVar3 * 2;
    ppaVar1 = (axbOpBackend_s **)malloc(sVar3 << 4);
    handle->opBackends = ppaVar1;
    for (sVar2 = 0; sVar3 != sVar2; sVar2 = sVar2 + 1) {
      handle->opBackends[sVar2] = __ptr[sVar2];
    }
    free(__ptr);
    sVar3 = handle->opBackends_size;
  }
  handle->opBackends[sVar3] = ops;
  handle->opBackends_size = sVar3 + 1;
  return 0;
}

Assistant:

axbStatus_t axbOpBackendRegister(struct axbHandle_s *handle, struct axbOpBackend_s *ops)
{
  // check if there is still room for another backend. If not, resize array:
  if (handle->opBackends_size == handle->opBackends_capacity) {
    struct axbOpBackend_s **old_array = handle->opBackends;
    handle->opBackends_capacity *= 2;
    handle->opBackends = malloc(handle->opBackends_capacity * sizeof(struct axbOpBackend_s *));

    // copy over existing backends:
    for (size_t i=0; i<handle->opBackends_size; ++i) handle->opBackends[i] = old_array[i];
    free(old_array);
  }

  handle->opBackends[handle->opBackends_size] = ops;
  handle->opBackends_size += 1;
  return 0;
}